

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_load.cpp
# Opt level: O3

bool __thiscall OPNMIDIplay::LoadBank(OPNMIDIplay *this,string *filename)

{
  bool bVar1;
  FileAndMemReader file;
  FileAndMemReader local_48;
  
  local_48.m_file_name._M_dataplus._M_p = (pointer)&local_48.m_file_name.field_2;
  local_48.m_file_name._M_string_length = 0;
  local_48.m_file_name.field_2._M_local_buf[0] = '\0';
  local_48.m_fp = (FILE *)0x0;
  local_48.m_mp = (void *)0x0;
  local_48.m_mp_size = 0;
  local_48.m_mp_tell = 0;
  FileAndMemReader::openFile(&local_48,(filename->_M_dataplus)._M_p);
  bVar1 = LoadBank(this,&local_48);
  FileAndMemReader::~FileAndMemReader(&local_48);
  return bVar1;
}

Assistant:

bool OPNMIDIplay::LoadBank(const std::string &filename)
{
    FileAndMemReader file;
    file.openFile(filename.c_str());
    return LoadBank(file);
}